

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

optional<unsigned_long> __thiscall wasm::WATParser::Lexer::takeI<unsigned_long>(Lexer *this)

{
  bool bVar1;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  string_view in;
  optional<unsigned_long> oVar3;
  long local_40;
  optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> result;
  
  in = next(this);
  anon_unknown_0::integer
            ((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)&local_40,in);
  uVar2 = &local_40;
  if (result.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
      _M_payload._M_value.sign._0_1_ == '\x01') {
    if (result.
        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
        _M_payload.
        super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
        _M_payload._M_value.n._0_4_ != 0) {
      bVar1 = -1 < (long)result.
                         super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                         ._M_payload.
                         super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                         ._M_payload._M_value.super_LexResult.span._M_str;
      if (result.
          super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
          _M_payload.
          super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
          _M_payload._M_value.n._0_4_ == 2) {
        bVar1 = (long)result.
                      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                      ._M_payload._M_value.super_LexResult.span._M_str < 1;
      }
      uVar2 = result.
              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
              ._M_payload.
              super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
              _M_payload._M_value.super_LexResult.span._M_str;
      if (!bVar1) goto LAB_00c0289c;
    }
    this->pos = this->pos + local_40;
    advance(this);
    uVar2 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
  }
  else {
LAB_00c0289c:
    result.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
    _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
    _M_payload._M_value.super_LexResult.span._M_str = (char *)uVar2;
    uVar2 = 0;
  }
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar2;
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value =
       (unsigned_long)
       result.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
       ._M_payload.
       super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>._M_payload
       ._M_value.super_LexResult.span._M_str;
  return (optional<unsigned_long>)
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<T> Lexer::takeI() {
  static_assert(std::is_integral_v<T> && std::is_unsigned_v<T>);
  if (auto result = integer(next())) {
    if (result->isUnsigned<T>() || result->isSigned<std::make_signed_t<T>>()) {
      pos += result->span.size();
      advance();
      return T(result->n);
    }
  }
  return std::nullopt;
}